

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

string_view_type __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as_string_view
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  byte bVar2;
  short_string_storage *psVar3;
  char_type *pcVar4;
  size_t __len;
  json_runtime_error<std::domain_error,_void> *this_00;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff78;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffe0;
  string_view_type local_10;
  
  jVar1 = storage_kind(in_RDI);
  switch(jVar1) {
  case short_str:
    psVar3 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
                       (in_stack_ffffffffffffff80);
    pcVar4 = short_string_storage::data(psVar3);
    psVar3 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
                       (in_stack_ffffffffffffff80);
    bVar2 = short_string_storage::length(psVar3);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,pcVar4,(ulong)bVar2);
    break;
  case json_const_reference:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffff80);
    json_const_reference_storage::value((json_const_reference_storage *)0x1e8116);
    local_10 = as_string_view(in_stack_ffffffffffffffe0);
    break;
  case json_reference:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffff80);
    json_reference_storage::value((json_reference_storage *)0x1e8142);
    local_10 = as_string_view(in_stack_ffffffffffffffe0);
    break;
  default:
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar5));
    json_runtime_error<std::domain_error,_void>::json_runtime_error
              (this_00,in_stack_ffffffffffffff78);
    __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case long_str:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
              (in_stack_ffffffffffffff80);
    pcVar4 = long_string_storage::data((long_string_storage *)0x1e80d6);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
              (in_stack_ffffffffffffff80);
    __len = long_string_storage::length((long_string_storage *)0x1e80ed);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10,pcVar4,__len)
    ;
  }
  return local_10;
}

Assistant:

string_view_type as_string_view() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                    return string_view_type(cast<short_string_storage>().data(),cast<short_string_storage>().length());
                case json_storage_kind::long_str:
                    return string_view_type(cast<long_string_storage>().data(),cast<long_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_string_view();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_string_view();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a string"));
            }
        }